

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveUleft(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *eps,
            number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *vec,int *vecidx,
            number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *rhs,int *rhsidx,int rhsn)

{
  uint *puVar1;
  int iVar2;
  int32_t iVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  fpclass_type fVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar13;
  uint uVar14;
  cpp_dec_float<50U,_int,_void> *pcVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  int *piVar22;
  int *piVar23;
  cpp_dec_float<50U,_int,_void> *pcVar24;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  cpp_dec_float<50U,_int,_void> local_218;
  ulong local_1d8;
  ulong local_1d0;
  cpp_dec_float<50U,_int,_void> local_1c8;
  cpp_dec_float<50U,_int,_void> local_188;
  cpp_dec_float<50U,_int,_void> local_148;
  int *local_110;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_108;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_100;
  int *local_f8;
  int *local_f0;
  pointer local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e0;
  int *local_d8;
  int *local_d0;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_c8;
  int *local_c0;
  int *local_b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b0;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_188.fpclass = cpp_dec_float_finite;
  local_188.prec_elem = 10;
  local_188.data._M_elems[0] = 0;
  local_188.data._M_elems[1] = 0;
  local_188.data._M_elems[2] = 0;
  local_188.data._M_elems[3] = 0;
  local_188.data._M_elems[4] = 0;
  local_188.data._M_elems[5] = 0;
  local_188.data._M_elems._24_5_ = 0;
  local_188.data._M_elems[7]._1_3_ = 0;
  local_188.data._M_elems[8] = 0;
  local_188.data._M_elems[9] = 0;
  local_188.exp = 0;
  local_188.neg = false;
  if (0 < rhsn) {
    local_c0 = (this->row).orig;
    piVar22 = (this->col).orig;
    local_b8 = (this->col).perm;
    uVar12 = 0;
    do {
      iVar7 = local_b8[rhsidx[uVar12]];
      if (uVar12 == 0) {
        lVar18 = 0;
      }
      else {
        uVar17 = uVar12 & 0xffffffff;
        do {
          uVar19 = (uint)uVar17 - 1;
          uVar20 = uVar19 >> 1;
          uVar21 = (uint)uVar17;
          if (rhsidx[uVar20] <= iVar7) break;
          rhsidx[uVar17] = rhsidx[uVar20];
          uVar17 = (ulong)uVar20;
          uVar21 = uVar20;
        } while (1 < uVar19);
        lVar18 = (long)(int)uVar21;
      }
      uVar12 = uVar12 + 1;
      rhsidx[lVar18] = iVar7;
    } while (uVar12 != (uint)rhsn);
    if (0 < rhsn) {
      local_e8 = (this->u).row.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      local_f0 = (this->u).row.idx;
      local_d0 = (this->u).row.len;
      local_f8 = (this->u).row.start;
      local_1d0 = 0;
      local_110 = piVar22;
      local_108 = eps;
      local_100 = rhs;
      local_e0 = vec;
      local_d8 = vecidx;
      local_c8 = this;
      do {
        iVar7 = *rhsidx;
        local_1d8 = (ulong)(rhsn - 1U);
        iVar5 = rhsidx[local_1d8];
        iVar11 = 1;
        iVar6 = 0;
        if (3 < (uint)rhsn) {
          iVar6 = 0;
          do {
            iVar2 = rhsidx[iVar11];
            iVar16 = rhsidx[(long)iVar11 + 1];
            if (iVar2 < iVar16) {
              iVar10 = iVar11;
              iVar16 = iVar2;
              if (iVar5 <= iVar2) goto LAB_002b4c7d;
            }
            else {
              if (iVar5 <= iVar16) goto LAB_002b4c7d;
              iVar10 = iVar11 + 1;
            }
            rhsidx[iVar6] = iVar16;
            iVar11 = iVar10 * 2 + 1;
            iVar6 = iVar10;
          } while (iVar11 < (int)(rhsn - 2U));
        }
        if ((iVar11 < (int)(rhsn - 1U)) && (rhsidx[iVar11] < iVar5)) {
          rhsidx[iVar6] = rhsidx[iVar11];
          iVar6 = iVar11;
        }
LAB_002b4c7d:
        rhsidx[iVar6] = iVar5;
        iVar5 = piVar22[iVar7];
        local_1c8.data._M_elems._32_8_ =
             *(undefined8 *)(local_100[iVar5].m_backend.data._M_elems + 8);
        local_1c8.data._M_elems._0_8_ = *(undefined8 *)local_100[iVar5].m_backend.data._M_elems;
        local_1c8.data._M_elems._8_8_ =
             *(undefined8 *)(local_100[iVar5].m_backend.data._M_elems + 2);
        puVar1 = local_100[iVar5].m_backend.data._M_elems + 4;
        local_1c8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        uVar4 = *(undefined8 *)(puVar1 + 2);
        local_1c8.data._M_elems._24_5_ = SUB85(uVar4,0);
        local_1c8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_1c8.exp = local_100[iVar5].m_backend.exp;
        local_1c8.neg = local_100[iVar5].m_backend.neg;
        local_1c8.fpclass = local_100[iVar5].m_backend.fpclass;
        local_1c8.prec_elem = local_100[iVar5].m_backend.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (&local_100[iVar5].m_backend,0);
        local_218.data._M_elems._32_5_ = local_1c8.data._M_elems._32_5_;
        local_218.data._M_elems[9]._1_3_ = local_1c8.data._M_elems[9]._1_3_;
        local_218.data._M_elems[4] = local_1c8.data._M_elems[4];
        local_218.data._M_elems[5] = local_1c8.data._M_elems[5];
        local_218.data._M_elems._24_5_ = local_1c8.data._M_elems._24_5_;
        local_218.data._M_elems[7]._1_3_ = local_1c8.data._M_elems[7]._1_3_;
        local_218.data._M_elems[0] = local_1c8.data._M_elems[0];
        local_218.data._M_elems[1] = local_1c8.data._M_elems[1];
        uVar4 = local_218.data._M_elems._0_8_;
        local_218.data._M_elems[2] = local_1c8.data._M_elems[2];
        local_218.data._M_elems[3] = local_1c8.data._M_elems[3];
        local_68.data._M_elems._0_8_ = *(undefined8 *)(local_108->m_backend).data._M_elems;
        local_68.data._M_elems._8_8_ = *(undefined8 *)((local_108->m_backend).data._M_elems + 2);
        local_68.data._M_elems._16_8_ = *(undefined8 *)((local_108->m_backend).data._M_elems + 4);
        local_68.data._M_elems._24_8_ = *(undefined8 *)((local_108->m_backend).data._M_elems + 6);
        local_68.data._M_elems._32_8_ = *(undefined8 *)((local_108->m_backend).data._M_elems + 8);
        local_68.exp = (local_108->m_backend).exp;
        local_68.neg = (local_108->m_backend).neg;
        local_68.fpclass = (local_108->m_backend).fpclass;
        local_68.prec_elem = (local_108->m_backend).prec_elem;
        local_218.exp = local_1c8.exp;
        local_218.neg = local_1c8.neg;
        local_218.fpclass = local_1c8.fpclass;
        local_218.prec_elem = local_1c8.prec_elem;
        if ((local_1c8.neg == true) &&
           (local_218.data._M_elems[0] = local_1c8.data._M_elems[0],
           local_218.data._M_elems[0] != 0 || local_1c8.fpclass != cpp_dec_float_finite)) {
          local_218.neg = false;
        }
        local_218.data._M_elems._0_8_ = uVar4;
        if ((local_68.fpclass != cpp_dec_float_NaN && local_1c8.fpclass != cpp_dec_float_NaN) &&
           (iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_218,&local_68), 0 < iVar5)) {
          iVar7 = local_c0[iVar7];
          iVar5 = (int)local_1d0;
          local_1d0 = (ulong)(iVar5 + 1);
          vecidx[iVar5] = iVar7;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&local_1c8,
                     &(local_c8->diag).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar7].m_backend);
          *(undefined8 *)vec[iVar7].m_backend.data._M_elems = local_1c8.data._M_elems._0_8_;
          *(undefined8 *)(vec[iVar7].m_backend.data._M_elems + 2) = local_1c8.data._M_elems._8_8_;
          puVar1 = vec[iVar7].m_backend.data._M_elems + 4;
          *(undefined8 *)puVar1 = local_1c8.data._M_elems._16_8_;
          *(ulong *)(puVar1 + 2) =
               CONCAT35(local_1c8.data._M_elems[7]._1_3_,local_1c8.data._M_elems._24_5_);
          *(undefined8 *)(vec[iVar7].m_backend.data._M_elems + 8) = local_1c8.data._M_elems._32_8_;
          vec[iVar7].m_backend.exp = local_1c8.exp;
          vec[iVar7].m_backend.neg = local_1c8.neg;
          vec[iVar7].m_backend.fpclass = local_1c8.fpclass;
          vec[iVar7].m_backend.prec_elem = local_1c8.prec_elem;
          iVar5 = local_d0[iVar7];
          piVar22 = local_110;
          if (iVar5 != 0) {
            pcVar24 = &local_e8[local_f8[iVar7]].m_backend;
            piVar23 = local_f0 + local_f8[iVar7];
            do {
              iVar7 = *piVar23;
              pnVar13 = local_100 + iVar7;
              local_188.data._M_elems._32_8_ =
                   *(undefined8 *)(local_100[iVar7].m_backend.data._M_elems + 8);
              local_188.data._M_elems._0_8_ =
                   *(undefined8 *)local_100[iVar7].m_backend.data._M_elems;
              local_188.data._M_elems._8_8_ =
                   *(undefined8 *)(local_100[iVar7].m_backend.data._M_elems + 2);
              puVar1 = local_100[iVar7].m_backend.data._M_elems + 4;
              local_188.data._M_elems._16_8_ = *(undefined8 *)puVar1;
              uVar4 = *(undefined8 *)(puVar1 + 2);
              local_188.data._M_elems._24_5_ = SUB85(uVar4,0);
              local_188.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
              local_188.exp = local_100[iVar7].m_backend.exp;
              local_188.neg = local_100[iVar7].m_backend.neg;
              local_188.fpclass = local_100[iVar7].m_backend.fpclass;
              local_188.prec_elem = local_100[iVar7].m_backend.prec_elem;
              if (local_188.fpclass == cpp_dec_float_NaN) {
LAB_002b4f20:
                local_218.fpclass = cpp_dec_float_finite;
                local_218.prec_elem = 10;
                local_218.data._M_elems[0] = 0;
                local_218.data._M_elems[1] = 0;
                local_218.data._M_elems[2] = 0;
                local_218.data._M_elems[3] = 0;
                local_218.data._M_elems[4] = 0;
                local_218.data._M_elems[5] = 0;
                local_218.data._M_elems._24_5_ = 0;
                local_218.data._M_elems[7]._1_3_ = 0;
                local_218.data._M_elems._32_5_ = 0;
                local_218.data._M_elems[9]._1_3_ = 0;
                local_218.exp = 0;
                local_218.neg = false;
                pcVar15 = &local_1c8;
                if (&local_218 != pcVar24) {
                  local_218.data._M_elems._32_5_ = local_1c8.data._M_elems._32_5_;
                  local_218.data._M_elems[9]._1_3_ = local_1c8.data._M_elems[9]._1_3_;
                  local_218.data._M_elems[4] = local_1c8.data._M_elems[4];
                  local_218.data._M_elems[5] = local_1c8.data._M_elems[5];
                  local_218.data._M_elems._24_5_ = local_1c8.data._M_elems._24_5_;
                  local_218.data._M_elems[7]._1_3_ = local_1c8.data._M_elems[7]._1_3_;
                  local_218.data._M_elems[0] = local_1c8.data._M_elems[0];
                  local_218.data._M_elems[1] = local_1c8.data._M_elems[1];
                  local_218.data._M_elems[2] = local_1c8.data._M_elems[2];
                  local_218.data._M_elems[3] = local_1c8.data._M_elems[3];
                  local_218.exp = local_1c8.exp;
                  local_218.neg = local_1c8.neg;
                  local_218.fpclass = local_1c8.fpclass;
                  local_218.prec_elem = local_1c8.prec_elem;
                  pcVar15 = pcVar24;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                          (&local_218,pcVar15);
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_188,&local_218);
                fVar8 = cpp_dec_float_NaN;
                if (local_188.fpclass == cpp_dec_float_NaN) {
LAB_002b4fe2:
                  local_148.data._M_elems._32_5_ = local_188.data._M_elems._32_5_;
                  local_148.data._M_elems[9]._1_3_ = local_188.data._M_elems[9]._1_3_;
                  local_148.data._M_elems[4] = local_188.data._M_elems[4];
                  local_148.data._M_elems[5] = local_188.data._M_elems[5];
                  local_148.data._M_elems._24_5_ = local_188.data._M_elems._24_5_;
                  local_148.data._M_elems[7]._1_3_ = local_188.data._M_elems[7]._1_3_;
                  local_148.data._M_elems[0] = local_188.data._M_elems[0];
                  local_148.data._M_elems[1] = local_188.data._M_elems[1];
                  local_148.data._M_elems[2] = local_188.data._M_elems[2];
                  local_148.data._M_elems[3] = local_188.data._M_elems[3];
                  pcVar15 = &local_188;
                  iVar7 = local_188.exp;
                  bVar9 = local_188.neg;
                }
                else {
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                  cpp_dec_float<long_long>(&local_218,0,(type *)0x0);
                  iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    (&local_188,&local_218);
                  if (iVar7 != 0) {
                    fVar8 = local_188.fpclass;
                    goto LAB_002b4fe2;
                  }
                  local_148.fpclass = cpp_dec_float_finite;
                  local_148.prec_elem = 10;
                  local_148.data._M_elems[0] = 0;
                  local_148.data._M_elems[1] = 0;
                  local_148.data._M_elems[2] = 0;
                  local_148.data._M_elems[3] = 0;
                  local_148.data._M_elems[4] = 0;
                  local_148.data._M_elems[5] = 0;
                  local_148.data._M_elems._24_5_ = 0;
                  local_148.data._M_elems[7]._1_3_ = 0;
                  local_148.data._M_elems._32_5_ = 0;
                  local_148.data._M_elems[9]._1_3_ = 0;
                  local_148.exp = 0;
                  local_148.neg = false;
                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                            ((cpp_dec_float<50u,int,void> *)&local_148,1e-100);
                  pcVar15 = &local_148;
                  fVar8 = local_148.fpclass;
                  iVar7 = local_148.exp;
                  bVar9 = local_148.neg;
                }
                iVar3 = pcVar15->prec_elem;
                *(ulong *)((pnVar13->m_backend).data._M_elems + 8) =
                     CONCAT35(local_148.data._M_elems[9]._1_3_,local_148.data._M_elems._32_5_);
                *(undefined8 *)((pnVar13->m_backend).data._M_elems + 4) =
                     local_148.data._M_elems._16_8_;
                *(ulong *)((pnVar13->m_backend).data._M_elems + 6) =
                     CONCAT35(local_148.data._M_elems[7]._1_3_,local_148.data._M_elems._24_5_);
                *(undefined8 *)(pnVar13->m_backend).data._M_elems = local_148.data._M_elems._0_8_;
                *(undefined8 *)((pnVar13->m_backend).data._M_elems + 2) =
                     local_148.data._M_elems._8_8_;
                (pnVar13->m_backend).exp = iVar7;
                (pnVar13->m_backend).neg = bVar9;
                (pnVar13->m_backend).fpclass = fVar8;
                (pnVar13->m_backend).prec_elem = iVar3;
                uVar4 = local_188.data._M_elems._16_8_;
              }
              else {
                local_b0 = pnVar13;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<long_long>(&local_218,0,(type *)0x0);
                pnVar13 = local_b0;
                iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_188,&local_218);
                if (iVar6 != 0) goto LAB_002b4f20;
                local_148.data._M_elems[0] = local_1c8.data._M_elems[0];
                local_148.data._M_elems[1] = local_1c8.data._M_elems[1];
                uVar4 = local_148.data._M_elems._0_8_;
                local_148.data._M_elems[2] = local_1c8.data._M_elems[2];
                local_148.data._M_elems[3] = local_1c8.data._M_elems[3];
                local_148.data._M_elems._32_5_ = local_1c8.data._M_elems._32_5_;
                local_148.data._M_elems[9]._1_3_ = local_1c8.data._M_elems[9]._1_3_;
                local_148.data._M_elems[4] = local_1c8.data._M_elems[4];
                local_148.data._M_elems[5] = local_1c8.data._M_elems[5];
                local_148.data._M_elems._24_5_ = local_1c8.data._M_elems._24_5_;
                local_148.data._M_elems[7]._1_3_ = local_1c8.data._M_elems[7]._1_3_;
                local_148.exp = local_1c8.exp;
                fVar8 = local_1c8.fpclass;
                iVar3 = local_1c8.prec_elem;
                local_148.fpclass = local_1c8.fpclass;
                local_148.prec_elem = local_1c8.prec_elem;
                local_148.data._M_elems[0] = local_1c8.data._M_elems[0];
                local_148.neg = local_1c8.neg;
                if (local_148.data._M_elems[0] != 0 || fVar8 != cpp_dec_float_finite) {
                  local_148.neg = (bool)(local_1c8.neg ^ 1);
                }
                local_218.fpclass = cpp_dec_float_finite;
                local_218.prec_elem = 10;
                local_218.data._M_elems[0] = 0;
                local_218.data._M_elems[1] = 0;
                local_218.data._M_elems[2] = 0;
                local_218.data._M_elems[3] = 0;
                local_218.data._M_elems[4] = 0;
                local_218.data._M_elems[5] = 0;
                local_218.data._M_elems._24_5_ = 0;
                local_218.data._M_elems[7]._1_3_ = 0;
                local_218.data._M_elems._32_5_ = 0;
                local_218.data._M_elems[9]._1_3_ = 0;
                local_218.exp = 0;
                local_218.neg = false;
                pcVar15 = &local_148;
                if (&local_218 != pcVar24) {
                  local_218.data._M_elems[4] = local_1c8.data._M_elems[4];
                  local_218.data._M_elems[5] = local_1c8.data._M_elems[5];
                  local_218.data._M_elems._24_5_ = local_1c8.data._M_elems._24_5_;
                  local_218.data._M_elems[7]._1_3_ = local_1c8.data._M_elems[7]._1_3_;
                  local_218.data._M_elems[0] = local_1c8.data._M_elems[0];
                  local_218.data._M_elems[1] = local_1c8.data._M_elems[1];
                  local_218.data._M_elems[2] = local_1c8.data._M_elems[2];
                  local_218.data._M_elems[3] = local_1c8.data._M_elems[3];
                  local_218.exp = local_1c8.exp;
                  local_218.fpclass = fVar8;
                  local_218.prec_elem = iVar3;
                  pcVar15 = pcVar24;
                  local_218.data._M_elems._32_5_ = local_148.data._M_elems._32_5_;
                  local_218.data._M_elems[9]._1_3_ = local_148.data._M_elems[9]._1_3_;
                  local_218.neg = local_148.neg;
                }
                local_148.data._M_elems._0_8_ = uVar4;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                          (&local_218,pcVar15);
                local_188.data._M_elems[9]._1_3_ = local_218.data._M_elems[9]._1_3_;
                local_188.data._M_elems._32_5_ = local_218.data._M_elems._32_5_;
                uVar4._0_4_ = local_218.data._M_elems[4];
                uVar4._4_4_ = local_218.data._M_elems[5];
                local_188.data._M_elems[4] = local_218.data._M_elems[4];
                local_188.data._M_elems[5] = local_218.data._M_elems[5];
                local_188.data._M_elems._24_5_ = local_218.data._M_elems._24_5_;
                local_188.data._M_elems[7]._1_3_ = local_218.data._M_elems[7]._1_3_;
                local_188.data._M_elems[0] = local_218.data._M_elems[0];
                local_188.data._M_elems[1] = local_218.data._M_elems[1];
                local_188.data._M_elems[2] = local_218.data._M_elems[2];
                local_188.data._M_elems[3] = local_218.data._M_elems[3];
                local_188.exp = local_218.exp;
                local_188.neg = local_218.neg;
                local_188.prec_elem = local_218.prec_elem;
                local_188.fpclass = local_218.fpclass;
                local_a8.data._M_elems._32_8_ =
                     *(undefined8 *)((local_108->m_backend).data._M_elems + 8);
                local_a8.data._M_elems._0_8_ = *(undefined8 *)(local_108->m_backend).data._M_elems;
                local_a8.data._M_elems._8_8_ =
                     *(undefined8 *)((local_108->m_backend).data._M_elems + 2);
                local_a8.data._M_elems._16_8_ =
                     *(undefined8 *)((local_108->m_backend).data._M_elems + 4);
                local_a8.data._M_elems._24_8_ =
                     *(undefined8 *)((local_108->m_backend).data._M_elems + 6);
                local_a8.exp = (local_108->m_backend).exp;
                local_a8.neg = (local_108->m_backend).neg;
                local_a8.fpclass = (local_108->m_backend).fpclass;
                local_a8.prec_elem = (local_108->m_backend).prec_elem;
                if ((local_218.neg == true) &&
                   (local_218.data._M_elems[0] != 0 || local_218.fpclass != cpp_dec_float_finite)) {
                  local_218.neg = false;
                }
                if ((local_a8.fpclass != cpp_dec_float_NaN && local_218.fpclass != cpp_dec_float_NaN
                    ) && (iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                  compare(&local_218,&local_a8),
                         uVar4 = local_188.data._M_elems._16_8_, 0 < iVar6)) {
                  *(undefined8 *)((pnVar13->m_backend).data._M_elems + 8) =
                       local_188.data._M_elems._32_8_;
                  *(undefined8 *)((pnVar13->m_backend).data._M_elems + 4) =
                       local_188.data._M_elems._16_8_;
                  *(ulong *)((pnVar13->m_backend).data._M_elems + 6) =
                       CONCAT35(local_188.data._M_elems[7]._1_3_,local_188.data._M_elems._24_5_);
                  *(undefined8 *)(pnVar13->m_backend).data._M_elems = local_188.data._M_elems._0_8_;
                  *(undefined8 *)((pnVar13->m_backend).data._M_elems + 2) =
                       local_188.data._M_elems._8_8_;
                  (pnVar13->m_backend).exp = local_188.exp;
                  (pnVar13->m_backend).neg = local_188.neg;
                  (pnVar13->m_backend).fpclass = local_188.fpclass;
                  (pnVar13->m_backend).prec_elem = local_188.prec_elem;
                  iVar7 = local_b8[iVar7];
                  uVar19 = (uint)local_1d8;
                  uVar21 = uVar19;
                  if (0 < (int)uVar19) {
                    do {
                      uVar14 = (uint)local_1d8 - 1;
                      uVar20 = uVar14 >> 1;
                      uVar21 = (uint)local_1d8;
                      if (rhsidx[uVar20] <= iVar7) break;
                      rhsidx[local_1d8 & 0xffffffff] = rhsidx[uVar20];
                      local_1d8 = (ulong)uVar20;
                      uVar21 = uVar20;
                    } while (1 < uVar14);
                  }
                  local_1d8 = (ulong)(uVar19 + 1);
                  rhsidx[(int)uVar21] = iVar7;
                }
              }
              local_188.data._M_elems._16_8_ = uVar4;
              piVar23 = piVar23 + 1;
              pcVar24 = pcVar24 + 1;
              iVar5 = iVar5 + -1;
              vec = local_e0;
              piVar22 = local_110;
              vecidx = local_d8;
            } while (iVar5 != 0);
          }
        }
        rhsn = (int)local_1d8;
      } while (0 < rhsn);
      goto LAB_002b5383;
    }
  }
  local_1d0 = 0;
LAB_002b5383:
  return (int)local_1d0;
}

Assistant:

int CLUFactor<R>::solveUleft(R eps,
                             R* vec, int* vecidx,
                             R* rhs, int* rhsidx, int rhsn)
{
   R x, y;
   int i, j, k, n, r, c;
   int* rorig, *corig, *cperm;
   int* ridx, *rlen, *rbeg, *idx;
   R* rval, *val;

   rorig = row.orig;
   corig = col.orig;
   cperm = col.perm;

   /*  move rhsidx to a heap
    */

   for(i = 0; i < rhsn;)
      enQueueMin(rhsidx, &i, cperm[rhsidx[i]]);

   ridx = u.row.idx;

   rval = u.row.val.data();

   rlen = u.row.len;

   rbeg = u.row.start;

   n = 0;

   while(rhsn > 0)
   {
      i = deQueueMin(rhsidx, &rhsn);
      assert(i >= 0 && i < thedim);
      c = corig[i];
      assert(c >= 0 && c < thedim);
      x = rhs[c];
      rhs[c] = 0;

      if(isNotZero(x, eps))
      {
         r = rorig[i];
         assert(r >= 0 && r < thedim);
         vecidx[n++] = r;
         x *= diag[r];
         vec[r] = x;
         k = rbeg[r];
         assert(k >= 0 && k < u.row.size);
         idx = &ridx[k];
         val = &rval[k];

         for(int m = rlen[r]; m; --m)
         {
            j = *idx++;
            assert(j >= 0 && j < thedim);
            y = rhs[j];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  rhs[j] = y;
                  enQueueMin(rhsidx, &rhsn, cperm[j]);
               }
            }
            else
            {
               y -= x * (*val++);
               rhs[j] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
            }
         }
      }
   }

   return n;
}